

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void pbrt::LogFatal(LogLevel level,char *file,int line,char *s)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  lock_guard<std::mutex> *in_stack_ffffffffffffff40;
  FILE *__stream;
  string local_78 [48];
  string local_48 [40];
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff40,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  __stream = _stderr;
  uVar2 = getpid();
  puVar3 = (uint *)ThreadIndex();
  uVar1 = *puVar3;
  (anonymous_namespace)::TimeNow_abi_cxx11_();
  uVar4 = std::__cxx11::string::c_str();
  ToString_abi_cxx11_((LogLevel)((ulong)__stream >> 0x20));
  uVar5 = std::__cxx11::string::c_str();
  fprintf(__stream,"[ %d.%03d %s %s:%d ] %s %s\n",(ulong)uVar2,(ulong)uVar1,uVar4,local_10,local_14,
          uVar5,local_20);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_48);
  CheckCallbackScope::Fail();
  abort();
}

Assistant:

void LogFatal(LogLevel level, const char *file, int line, const char *s) {
#ifdef PBRT_IS_GPU_CODE
    Log(LogLevel::Fatal, file, line, s);
    __threadfence();
    asm("trap;");
#else
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock(mutex);

    fprintf(stderr, "[ " LOG_BASE_FMT " %s:%d ] %s %s\n", LOG_BASE_ARGS, file, line,
            ToString(level).c_str(), s);

    CheckCallbackScope::Fail();
    abort();
#endif
}